

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::init
          (PointRenderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ContextInfo *pCVar3;
  NotSupportedError *pNVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  EVP_PKEY_CTX *ctx_00;
  char *local_228;
  MessageBuilder local_220;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_74 [4];
  float local_70;
  GLfloat pointSizeRange [2];
  allocator<char> local_31;
  string local_30;
  PointRenderCase *local_10;
  PointRenderCase *this_local;
  
  local_10 = this;
  if ((this->m_isWidePointCase & 1U) != 0) {
    if (((this->super_BBoxRenderCase).m_hasGeometryStage & 1U) != 0) {
      pCVar3 = gles31::Context::getContextInfo
                         ((this->super_BBoxRenderCase).super_TestCase.m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_geometry_point_size");
      if (!bVar1) {
        pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"Test requires GL_EXT_geometry_point_size extension",
                   &local_31);
        tcu::NotSupportedError::NotSupportedError(pNVar4,&local_30);
        __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    if ((((this->super_BBoxRenderCase).m_hasTessellationStage & 1U) != 0) &&
       (((this->super_BBoxRenderCase).m_hasGeometryStage & 1U) == 0)) {
      pCVar3 = gles31::Context::getContextInfo
                         ((this->super_BBoxRenderCase).super_TestCase.m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_tessellation_point_size");
      if (!bVar1) {
        pointSizeRange[0]._2_1_ = 1;
        pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(pointSizeRange + 1),
                   "Test requires GL_EXT_tessellation_point_size extension",
                   (allocator<char> *)((long)pointSizeRange + 3));
        tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)(pointSizeRange + 1));
        pointSizeRange[0]._2_1_ = 0;
        __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    memset(local_74,0,8);
    pRVar5 = gles31::Context::getRenderContext
                       ((this->super_BBoxRenderCase).super_TestCase.m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x818))(0x846d,local_74);
    if (local_70 < 5.0) {
      local_9a = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Test requires point size 5.0",&local_99);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_98);
      local_9a = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = tcu::TestContext::getLog
                      ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_220,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [28])"Rendering point pattern to ");
  local_228 = "fbo";
  if ((this->super_BBoxRenderCase).m_renderTarget == RENDERTARGET_DEFAULT) {
    local_228 = "default frame buffer";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_228);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c89945);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [67])
                             "Half of the points are green, half blue. Using additive blending.\n");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [83])
                             "Points are in random order, varying pattern size and location for each iteration.\n"
                     );
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [107])
                             "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
                     );
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_220);
  generateAttributeData(this);
  iVar2 = BBoxRenderCase::init(&this->super_BBoxRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void PointRenderCase::init (void)
{
	if (m_isWidePointCase)
	{
		// extensions
		if (m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_geometry_point_size extension");
		if (m_hasTessellationStage && !m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_point_size extension");

		// point size range
		{
			glw::GLfloat pointSizeRange[2] = {0.0f, 0.0f};
			m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, pointSizeRange);

			if (pointSizeRange[1] < 5.0f)
				throw tcu::NotSupportedError("Test requires point size 5.0");
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering point pattern to " << ((m_renderTarget == RENDERTARGET_DEFAULT) ? ("default frame buffer") : ("fbo")) << ".\n"
		<< "Half of the points are green, half blue. Using additive blending.\n"
		<< "Points are in random order, varying pattern size and location for each iteration.\n"
		<< "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
		<< tcu::TestLog::EndMessage;

	generateAttributeData();

	BBoxRenderCase::init();
}